

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_function_args(FILE *out,Type_Function *func)

{
  ulong uVar1;
  
  if ((func->number_of_arguments != 0) &&
     (print_denoted(out,(Denoted *)*func->arguments), 1 < func->number_of_arguments)) {
    uVar1 = 1;
    do {
      fwrite(", ",2,1,(FILE *)out);
      print_denoted(out,(Denoted *)func->arguments[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < func->number_of_arguments);
  }
  return;
}

Assistant:

void print_function_args(FILE *out,struct Type_Function *func)
{
	size_t i;
	if(func->number_of_arguments==0)
		return;

	print_denoted(out,(struct Denoted*)func->arguments[0]);
	for(i=1;i<func->number_of_arguments;++i)
	{
		fprintf(out,", ");
		print_denoted(out,(struct Denoted*)func->arguments[i]);
	}	
}